

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O1

bool __thiscall
test_case::eval(test_case *this,ggml_backend_t backend1,ggml_backend_t backend2,char *op_name)

{
  pointer ppgVar1;
  ggml_backend_t pgVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  ggml_context *ctx;
  ggml_cgraph *pgVar7;
  undefined4 extraout_var;
  long lVar8;
  undefined8 uVar9;
  char *__s;
  pointer ppgVar10;
  bool bVar11;
  callback_userdata ud;
  ggml_backend_t local_b0 [2];
  ggml_backend_t local_a0;
  ggml_backend_t local_98;
  undefined8 local_90;
  long local_88;
  undefined8 uStack_80;
  undefined1 local_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  this->mode = MODE_TEST;
  lVar6 = ggml_tensor_overhead();
  local_88 = ggml_graph_overhead();
  local_88 = local_88 + lVar6 * 0x80;
  uStack_80 = 0;
  local_78 = 1;
  ctx = (ggml_context *)ggml_init();
  if (ctx == (ggml_context *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-backend-ops.cpp"
               ,0x1bc,"GGML_ASSERT(%s) failed","ctx");
  }
  pgVar7 = (ggml_cgraph *)ggml_new_graph(ctx);
  this->gf = pgVar7;
  add_sentinel(this,ctx);
  iVar5 = (*this->_vptr_test_case[4])(this,ctx);
  uVar9 = CONCAT44(extraout_var,iVar5);
  if (op_name == (char *)0x0) {
    bVar11 = false;
  }
  else {
    (*this->_vptr_test_case[2])(local_50,this,uVar9);
    iVar5 = std::__cxx11::string::compare((char *)local_50);
    bVar11 = iVar5 != 0;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  if (!bVar11) {
    local_90 = uVar9;
    (*this->_vptr_test_case[2])(local_b0,this,uVar9);
    pgVar2 = local_b0[0];
    (*this->_vptr_test_case[3])(local_70,this);
    printf("  %s(%s): ",pgVar2,local_70[0]);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (local_b0[0] != (ggml_backend_t)&local_a0) {
      operator_delete(local_b0[0],(long)local_a0 + 1);
    }
    fflush(_stdout);
    local_b0[0] = backend1;
    local_b0[1] = backend2;
    bVar11 = true;
    lVar6 = 0;
    do {
      uVar9 = *(undefined8 *)((long)local_b0 + lVar6);
      for (lVar8 = ggml_get_first_tensor(ctx); lVar8 != 0; lVar8 = ggml_get_next_tensor(ctx,lVar8))
      {
        cVar3 = ggml_backend_supports_op(uVar9,lVar8);
        if (cVar3 == '\0') {
          uVar9 = ggml_backend_name(uVar9);
          bVar11 = false;
          printf("not supported [%s] ",uVar9);
          break;
        }
      }
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x10);
    if (bVar11) {
      add_sentinel(this,ctx);
      lVar6 = ggml_backend_alloc_ctx_tensors(ctx,backend1);
      if (lVar6 != 0) {
        ggml_build_forward_expand(this->gf,local_90);
        ppgVar1 = (this->sentinels).
                  super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppgVar10 = (this->sentinels).
                        super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                        super__Vector_impl_data._M_start; ppgVar10 != ppgVar1;
            ppgVar10 = ppgVar10 + 1) {
          ggml_graph_add_node(this->gf,*ppgVar10);
        }
        (*this->_vptr_test_case[0xb])(this,ctx);
        local_b0[0] = (ggml_backend_t)CONCAT71(local_b0[0]._1_7_,1);
        (*this->_vptr_test_case[5])(this);
        local_a0 = backend1;
        local_98 = backend2;
        bVar4 = ggml_backend_compare_graph_backend
                          (backend1,backend2,this->gf,eval::anon_class_1_0_00000001::__invoke,
                           local_b0);
        if (bVar4 == 0) {
          printf("compare failed ");
        }
        ggml_backend_buffer_free(lVar6);
        ggml_free(ctx);
        bVar4 = (byte)local_b0[0] & bVar4;
        __s = "\x1b[1;31mFAIL\x1b[0m";
        if (bVar4 != 0) {
          __s = "\x1b[1;32mOK\x1b[0m";
        }
        puts(__s);
        return (bool)bVar4;
      }
      uVar9 = ggml_backend_name(backend1);
      printf("failed to allocate tensors [%s] ",uVar9);
      ggml_free(ctx);
      return false;
    }
    putchar(10);
  }
  ggml_free(ctx);
  return true;
}

Assistant:

bool eval(ggml_backend_t backend1, ggml_backend_t backend2, const char * op_name) {
        mode = MODE_TEST;

        ggml_init_params params = {
            /* .mem_size = */ ggml_tensor_overhead()*128 + ggml_graph_overhead(),
            /* .mem_base = */ NULL,
            /* .no_alloc = */ true,
        };
        ggml_context * ctx = ggml_init(params);
        GGML_ASSERT(ctx);

        gf = ggml_new_graph(ctx);

        // pre-graph sentinel
        add_sentinel(ctx);

        ggml_tensor * out = build_graph(ctx);

        if (op_name != nullptr && op_desc(out) != op_name) {
            //printf("  %s: skipping\n", op_desc(out).c_str());
            ggml_free(ctx);
            return true;
        }

        printf("  %s(%s): ", op_desc(out).c_str(), vars().c_str());
        fflush(stdout);

        // check if the backends support the ops
        bool supported = true;
        for (ggml_backend_t backend : {backend1, backend2}) {
            for (ggml_tensor * t = ggml_get_first_tensor(ctx); t != NULL; t = ggml_get_next_tensor(ctx, t)) {
                if (!ggml_backend_supports_op(backend, t)) {
                    printf("not supported [%s] ", ggml_backend_name(backend));
                    supported = false;
                    break;
                }
            }
        }
        if (!supported) {
            printf("\n");
            ggml_free(ctx);
            return true;
        }

        // post-graph sentinel
        add_sentinel(ctx);

        // allocate
        ggml_backend_buffer_t buf = ggml_backend_alloc_ctx_tensors(ctx, backend1);

        if (buf == NULL) {
            printf("failed to allocate tensors [%s] ", ggml_backend_name(backend1));
            ggml_free(ctx);
            return false;
        }

        // build graph
        ggml_build_forward_expand(gf, out);

        // add sentinels as graph nodes so that they are checked in the callback
        for (ggml_tensor * sentinel : sentinels) {
            ggml_graph_add_node(gf, sentinel);
        }

        // randomize tensors
        initialize_tensors(ctx);

        // compare
        struct callback_userdata {
            bool   ok;
            double max_err;
            ggml_backend_t backend1;
            ggml_backend_t backend2;
        };

        callback_userdata ud {
            true,
            max_nmse_err(),
            backend1,
            backend2
        };

        auto callback = [](int index, ggml_tensor * t1, ggml_tensor * t2, void * user_data) -> bool {
            callback_userdata * ud = (callback_userdata *) user_data;
            const char * bn1 = ggml_backend_name(ud->backend1);
            const char * bn2 = ggml_backend_name(ud->backend2);

            if (t1->op == GGML_OP_NONE) {
                // sentinels must be unchanged
                std::vector<uint8_t> t1_data(ggml_nbytes(t1));
                std::vector<uint8_t> t2_data(ggml_nbytes(t2));
                ggml_backend_tensor_get(t1, t1_data.data(), 0, ggml_nbytes(t1));
                ggml_backend_tensor_get(t2, t2_data.data(), 0, ggml_nbytes(t2));

                if (memcmp(t1_data.data(), t2_data.data(), ggml_nbytes(t1)) != 0) {
                    printf("sentinel mismatch: %s ", t1->name);
                    ud->ok = false;
                    return true;
                }
            }

            std::vector<float> f1 = tensor_to_float(t1);
            std::vector<float> f2 = tensor_to_float(t2);

            for (size_t i = 0; i < f1.size(); i++) {
                // check for nans
                if (std::isnan(f1[i]) || std::isnan(f2[i])) {
                    printf("[%s] NaN at index %zu (%s=%f %s=%f) ", ggml_op_desc(t1), i, bn1, f1[i], bn2, f2[i]);
                    ud->ok = false;
                    return true;
                }
                // check for infs: both must be inf of the same sign, or both must be finite
                if (isinf_or_max(f1[i]) || isinf_or_max(f2[i])) {
                    if (isinf_or_max(f1[i]) && isinf_or_max(f2[i])) {
                        if (std::signbit(f1[i]) != std::signbit(f2[i])) {
                            printf("[%s] inf sign mismatch: %s=%f %s=%f ", ggml_op_desc(t1), bn1, f1[i], bn2, f2[i]);
                            ud->ok = false;
                            return true;
                        }
                    } else {
                        printf("[%s] inf mismatch: %s=%f %s=%f ", ggml_op_desc(t1), bn1, f1[i], bn2, f2[i]);
                        ud->ok = false;
                        return true;
                    }
                }
            }

            double err = nmse(f1.data(), f2.data(), f1.size());
            if (err > ud->max_err) {
                printf("[%s] NMSE = %.9f > %.9f ", ggml_op_desc(t1), err, ud->max_err);
                //for (int i = 0; i < (int) f1.size(); i++) {
                //    printf("%5d %9.6f %9.6f, diff = %9.6f\n", i, f1[i], f2[i], f1[i] - f2[i]);
                //}
                //printf("\n");
                //exit(1);
                ud->ok = false;
            }
            return true;

            GGML_UNUSED(index);
        };

        const bool cmp_ok = ggml_backend_compare_graph_backend(backend1, backend2, gf, callback, &ud);

        if (!cmp_ok) {
            printf("compare failed ");
        }

        ggml_backend_buffer_free(buf);

        ggml_free(ctx);

        if (ud.ok && cmp_ok) {
            printf("\033[1;32mOK\033[0m\n");
            return true;
        }

        printf("\033[1;31mFAIL\033[0m\n");
        return false;
    }